

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status
aspa_table_update_swap_in_compute
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update **update)

{
  aspa_status aVar1;
  aspa_update *paVar2;
  long in_FS_OFFSET;
  aspa_status res;
  aspa_update **update_local;
  size_t count_local;
  aspa_update_operation *operations_local;
  rtr_socket *rtr_socket_local;
  aspa_table *aspa_table_local;
  aspa_array *local_28;
  aspa_array *new_array;
  aspa_array *a;
  aspa_store_node **node;
  
  node = *(aspa_store_node ***)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a5,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a6,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if (update == (aspa_update **)0x0) {
    __assert_fail("update",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x1a7,
                  "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                 );
  }
  if ((((aspa_table == (aspa_table *)0x0) || (rtr_socket == (rtr_socket *)0x0)) ||
      (update == (aspa_update **)0x0)) ||
     ((count != 0 && (operations == (aspa_update_operation *)0x0)))) {
    aspa_table_local._4_4_ = ASPA_ERROR;
  }
  else if (count == 0) {
    aspa_table_local._4_4_ = ASPA_SUCCESS;
  }
  else {
    if (*update == (aspa_update *)0x0) {
      paVar2 = (aspa_update *)lrtr_malloc(0x30);
      *update = paVar2;
      if (*update == (aspa_update *)0x0) {
        aspa_table_local._4_4_ = ASPA_ERROR;
        goto LAB_00111f13;
      }
    }
    pthread_rwlock_wrlock((pthread_rwlock_t *)&aspa_table->update_lock);
    (*update)->table = aspa_table;
    (*update)->operations = operations;
    (*update)->operation_count = count;
    (*update)->failed_operation = (aspa_update_operation *)0x0;
    qsort(operations,count,0x30,compare_update_operations);
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    a = (aspa_array *)aspa_store_get_node(&aspa_table->store,rtr_socket);
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    if ((a == (aspa_array *)0x0) || (*(long *)a == 0)) {
      new_array = (aspa_array *)0x0;
      aVar1 = aspa_array_create(&new_array);
      if (aVar1 != ASPA_SUCCESS) {
        aspa_table_local._4_4_ = ASPA_ERROR;
        goto LAB_00111f13;
      }
      pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
      aVar1 = aspa_store_create_node
                        (&aspa_table->store,rtr_socket,new_array,(aspa_store_node ***)&a);
      if (((aVar1 != ASPA_SUCCESS) || (a == (aspa_array *)0x0)) || (*(long *)a == 0)) {
        aspa_array_free(new_array,false);
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        aspa_table_local._4_4_ = ASPA_ERROR;
        goto LAB_00111f13;
      }
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
    }
    if (a == (aspa_array *)0x0) {
      __assert_fail("node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x1db,
                    "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                   );
    }
    if (*(long *)a == 0) {
      __assert_fail("*node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x1dc,
                    "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                   );
    }
    if (**(long **)a == 0) {
      __assert_fail("(*node)->aspa_array",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                    ,0x1dd,
                    "enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update **)"
                   );
    }
    local_28 = (aspa_array *)0x0;
    aVar1 = aspa_array_create(&local_28);
    if (aVar1 == ASPA_SUCCESS) {
      pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
      aspa_table_local._4_4_ =
           aspa_table_update_compute_internal
                     (rtr_socket,(aspa_array *)**(undefined8 **)a,local_28,operations,count,
                      &(*update)->failed_operation);
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      if (aspa_table_local._4_4_ == ASPA_SUCCESS) {
        (*update)->node = *(aspa_store_node **)a;
        (*update)->new_array = local_28;
      }
      else {
        (*update)->node = (aspa_store_node *)0x0;
        (*update)->new_array = (aspa_array *)0x0;
        aspa_array_free(local_28,false);
      }
    }
    else {
      aspa_table_local._4_4_ = ASPA_ERROR;
    }
  }
LAB_00111f13:
  if (*(aspa_store_node ***)(in_FS_OFFSET + 0x28) != node) {
    __stack_chk_fail();
  }
  return aspa_table_local._4_4_;
}

Assistant:

enum aspa_status aspa_table_update_swap_in_compute(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						   struct aspa_update_operation *operations, size_t count,
						   struct aspa_update **update)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);
	assert(update);

	if (!aspa_table || !rtr_socket || !update || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	if (!*update) {
		*update = lrtr_malloc(sizeof(struct aspa_update));

		if (!*update)
			return ASPA_ERROR;
	}

	// MARK: Update Lock
	// Prevent interim writes to the table: We need to make sure the table stays the same
	// until the cleanup since the computed update is based on the state the table is in right now
	pthread_rwlock_wrlock(&aspa_table->update_lock);

	(*update)->table = aspa_table;
	(*update)->operations = operations;
	(*update)->operation_count = count;
	(*update)->failed_operation = NULL;

	// stable sort operations, so operations dealing with the same customer ASN
	// are located right next to each other
	qsort(operations, count, sizeof(struct aspa_update_operation), compare_update_operations);

	pthread_rwlock_rdlock(&aspa_table->lock);
	struct aspa_store_node **node = aspa_store_get_node(&aspa_table->store, rtr_socket);

	pthread_rwlock_unlock(&aspa_table->lock);

	if (!node || !*node) {
		// The given table doesn't have a node for that socket, so create one
		struct aspa_array *a = NULL;

		if (aspa_array_create(&a) != ASPA_SUCCESS)
			return ASPA_ERROR;

		// Insert into table
		pthread_rwlock_wrlock(&aspa_table->lock);
		if (aspa_store_create_node(&aspa_table->store, rtr_socket, a, &node) != ASPA_SUCCESS || !node ||
		    !*node) {
			aspa_array_free(a, false);
			pthread_rwlock_unlock(&aspa_table->lock);
			return ASPA_ERROR;
		}
		pthread_rwlock_unlock(&aspa_table->lock);
	}

	assert(node);
	assert(*node);
	assert((*node)->aspa_array);

	// Create new array that will hold updated record data
	struct aspa_array *new_array = NULL;

	if (aspa_array_create(&new_array) != ASPA_SUCCESS)
		return ASPA_ERROR;

	// Populate new_array
	pthread_rwlock_rdlock(&aspa_table->lock);
	enum aspa_status res = aspa_table_update_compute_internal(rtr_socket, (*node)->aspa_array, new_array,
								  operations, count, &(*update)->failed_operation);
	pthread_rwlock_unlock(&aspa_table->lock);

	if (res == ASPA_SUCCESS) {
		(*update)->node = *node;
		(*update)->new_array = new_array;
	} else {
		(*update)->node = NULL;
		(*update)->new_array = NULL;

		// Update computation failed so release newly created array.
		// We must not release associated provider arrays here.
		aspa_array_free(new_array, false);
	}
	return res;
}